

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_cpu_features.c
# Opt level: O0

void printJson(Node *current)

{
  Node *current_00;
  uint *in_RDI;
  
  current_00 = (Node *)(ulong)*in_RDI;
  switch(current_00) {
  case (Node *)0x0:
    break;
  case (Node *)0x1:
    printf("%d",(ulong)in_RDI[1]);
    break;
  case (Node *)0x2:
    putchar(0x7b);
    if (*(long *)(in_RDI + 6) != 0) {
      printJson(current_00);
    }
    putchar(0x7d);
    break;
  case (Node *)0x3:
    printf("\"%s\":",*(undefined8 *)(in_RDI + 2));
    printJson(current_00);
    if (*(long *)(in_RDI + 6) != 0) {
      putchar(0x2c);
      printJson(current_00);
    }
    break;
  case (Node *)0x4:
    putchar(0x5b);
    if (*(long *)(in_RDI + 6) != 0) {
      printJson(current_00);
    }
    putchar(0x5d);
    break;
  case (Node *)0x5:
    printJson(current_00);
    if (*(long *)(in_RDI + 6) != 0) {
      putchar(0x2c);
      printJson(current_00);
    }
    break;
  case (Node *)0x6:
    printJsonString((char *)current_00);
  }
  return;
}

Assistant:

static void printJson(const Node* current) {
  assert(current);
  switch (current->type) {
    case NT_INVALID:
      break;
    case NT_INT:
      printf("%d", current->integer);
      break;
    case NT_STRING:
      printJsonString(current->string);
      break;
    case NT_ARRAY:
      putchar('[');
      if (current->next) printJson(current->next);
      putchar(']');
      break;
    case NT_MAP:
      putchar('{');
      if (current->next) printJson(current->next);
      putchar('}');
      break;
    case NT_MAP_ENTRY:
      printf("\"%s\":", current->string);
      printJson(current->value);
      if (current->next) {
        putchar(',');
        printJson(current->next);
      }
      break;
    case NT_ARRAY_ELEMENT:
      printJson(current->value);
      if (current->next) {
        putchar(',');
        printJson(current->next);
      }
      break;
  }
}